

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O3

int Option::parseCommandLine(QStringList *args,QMakeCmdLineParserState *state)

{
  QString *pQVar1;
  FILE *pFVar2;
  Data *pDVar3;
  qsizetype qVar4;
  Data *pDVar5;
  char cVar6;
  bool bVar7;
  bool bVar8;
  ArgumentReturn AVar9;
  int iVar10;
  iterator iVar11;
  iterator iVar12;
  long lVar13;
  undefined8 *puVar14;
  char16_t *pcVar15;
  int iVar16;
  QStringList *this;
  undefined8 *puVar17;
  long in_FS_OFFSET;
  QFileInfo fi;
  int x;
  int local_10c;
  QArrayData *local_100;
  undefined8 *local_f8;
  QArrayData *local_e8;
  undefined8 *local_e0;
  undefined1 *local_d0 [7];
  QString local_98;
  QString local_78;
  QString local_58;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  if ((args->d).size == 0) {
LAB_0029ca0f:
    iVar10 = 0;
  }
  else {
    bVar7 = false;
LAB_0029c10f:
    do {
      if (!bVar7) {
        AVar9 = QMakeGlobals::addCommandLineArguments(globals,state,args,&local_3c);
        if (AVar9 == ArgumentMalformed) {
          parseCommandLine();
        }
        else {
          if ((globals->qtconf).d.size != 0) {
            QLibraryInfoPrivate::setQtconfManualPath((QString *)&globals->qtconf);
          }
          bVar7 = false;
          if (AVar9 == ArgumentsOk) {
LAB_0029c60c:
            local_3c = local_3c + 1;
          }
          else {
            lVar13 = (long)local_3c;
            pQVar1 = (args->d).ptr;
            local_58.d.d = pQVar1[lVar13].d.d;
            local_58.d.ptr = pQVar1[lVar13].d.ptr;
            local_58.d.size = pQVar1[lVar13].d.size;
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
              super___atomic_base<int>._M_i =
                   (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                   super___atomic_base<int>._M_i + 1;
              UNLOCK();
            }
            cVar6 = QString::startsWith((QChar)(char16_t)&local_58,0x2d);
            if (cVar6 == '\0') {
              if (qmake_mode - QMAKE_SET_PROPERTY < 3) {
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)&prop::properties,prop::properties.d.size,
                           &local_58);
                QList<QString>::end(&prop::properties);
              }
              else {
                local_d0[0] = &DAT_aaaaaaaaaaaaaaaa;
                QFileInfo::QFileInfo((QFileInfo *)local_d0,(QString *)&local_58);
                cVar6 = QFileInfo::makeAbsolute();
                if (cVar6 == '\0') {
                  QFileInfo::filePath();
                  pcVar15 = local_58.d.ptr;
                  pDVar5 = local_58.d.d;
                  qVar4 = local_78.d.size;
                  pDVar3 = local_78.d.d;
                  local_78.d.d = local_58.d.d;
                  local_58.d.d = pDVar3;
                  local_58.d.ptr = local_78.d.ptr;
                  local_78.d.ptr = pcVar15;
                  local_78.d.size = local_58.d.size;
                  local_58.d.size = qVar4;
                  if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
                    ;
                    UNLOCK();
                    if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
                    {
                      QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
                    }
                  }
                }
                if ((qmake_mode & ~QMAKE_GENERATE_PROJECT) == QMAKE_GENERATE_MAKEFILE) {
                  cVar6 = QFileInfo::isDir();
                  this = &mkfile::project_files;
                  if (cVar6 != '\0') {
                    local_78.d.d = (Data *)0x0;
                    local_78.d.ptr = (char16_t *)0x0;
                    local_78.d.size = 0;
                    local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                    local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                    local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                    detectProjectFile(&local_98,&local_58,&local_78);
                    pcVar15 = local_98.d.ptr;
                    pFVar2 = _stderr;
                    if (local_98.d.ptr == (char16_t *)0x0) {
                      QString::toUtf8_helper((QString *)&local_e8);
                      puVar17 = local_e0;
                      if (local_e0 == (undefined8 *)0x0) {
                        puVar17 = &QByteArray::_empty;
                      }
                      QString::toUtf8_helper((QString *)&local_100);
                      puVar14 = local_f8;
                      if (local_f8 == (undefined8 *)0x0) {
                        puVar14 = &QByteArray::_empty;
                      }
                      fprintf(pFVar2,
                              "***Cannot detect .pro file in directory \'%s\'.\n\nQMake expects the file \'%s\' or exactly one .pro file in the given directory.\n"
                              ,puVar17,puVar14);
                      if (local_100 != (QArrayData *)0x0) {
                        LOCK();
                        (local_100->ref_)._q_value.super___atomic_base<int>._M_i =
                             (local_100->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((local_100->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(local_100,1,0x10);
                        }
                      }
                      if (local_e8 != (QArrayData *)0x0) {
                        LOCK();
                        (local_e8->ref_)._q_value.super___atomic_base<int>._M_i =
                             (local_e8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((local_e8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(local_e8,1,0x10);
                        }
                      }
                      local_10c = 4;
                    }
                    else {
                      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                                ((QMovableArrayOps<QString> *)&mkfile::project_files,
                                 mkfile::project_files.d.size,&local_98);
                      QList<QString>::end(&mkfile::project_files);
                    }
                    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_98.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_78.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    QFileInfo::~QFileInfo((QFileInfo *)local_d0);
                    if (pcVar15 == (char16_t *)0x0) {
                      bVar7 = false;
                      iVar16 = 1;
                      goto LAB_0029c5cb;
                    }
                    goto LAB_0029c5b2;
                  }
                }
                else {
                  this = &projfile::project_dirs;
                  if (qmake_mode != QMAKE_GENERATE_PROJECT) {
                    QFileInfo::~QFileInfo((QFileInfo *)local_d0);
LAB_0029c638:
                    iVar16 = 1;
                    local_10c = 5;
                    goto LAB_0029c5c8;
                  }
                }
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)this,(this->d).size,&local_58);
                QList<QString>::end(this);
                QFileInfo::~QFileInfo((QFileInfo *)local_d0);
              }
LAB_0029c5b2:
              QList<QString>::removeAt(args,(long)local_3c);
              iVar16 = 2;
LAB_0029c5c8:
              bVar7 = false;
            }
            else {
              bVar7 = comparesEqual(&local_58,"-d");
              if (bVar7) {
                debug_level = debug_level + 1;
                goto LAB_0029c26e;
              }
              bVar7 = comparesEqual(&local_58,"-v");
              if (((bVar7) || (bVar7 = comparesEqual(&local_58,"-version"), bVar7)) ||
                 (bVar7 = comparesEqual(&local_58,"--version"), bVar7)) {
                pFVar2 = _stdout;
                QMakeLibraryInfo::path(&local_98,3);
                QString::toLatin1_helper_inplace((QString *)&local_78);
                pcVar15 = local_78.d.ptr;
                if (local_78.d.ptr == (char16_t *)0x0) {
                  pcVar15 = (char16_t *)&QByteArray::_empty;
                }
                fprintf(pFVar2,"QMake version %s\nUsing Qt version %s in %s\n","3.1","6.10.0",
                        pcVar15);
                if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
                  }
                }
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                  }
                }
                iVar16 = 1;
                local_10c = 2;
                goto LAB_0029c5c8;
              }
              bVar8 = comparesEqual(&local_58,"-h");
              iVar16 = 1;
              bVar7 = false;
              if (((bVar8) || (bVar8 = comparesEqual(&local_58,"-help"), bVar8)) ||
                 (bVar8 = comparesEqual(&local_58,"--help"), bVar8)) {
                local_10c = 1;
                bVar7 = false;
                goto LAB_0029c5cb;
              }
              bVar8 = comparesEqual(&local_58,"-Wall");
              if (bVar8) {
                warn_level = CONCAT31(warn_level._1_3_,0xff);
              }
              else {
                bVar8 = comparesEqual(&local_58,"-Wparser");
                if (bVar8) {
                  warn_level = warn_level | 1;
                }
                else {
                  bVar8 = comparesEqual(&local_58,"-Wlogic");
                  if (bVar8) {
                    warn_level = warn_level | 2;
                  }
                  else {
                    bVar8 = comparesEqual(&local_58,"-Wdeprecated");
                    if (bVar8) {
                      warn_level = warn_level | 4;
                    }
                    else {
                      bVar8 = comparesEqual(&local_58,"-Wnone");
                      if (!bVar8) {
                        bVar8 = comparesEqual(&local_58,"-r");
                        if ((bVar8) || (bVar8 = comparesEqual(&local_58,"-recursive"), bVar8)) {
                          recursive = true;
                        }
                        else {
                          bVar8 = comparesEqual(&local_58,"-nr");
                          if ((!bVar8) && (bVar8 = comparesEqual(&local_58,"-norecursive"), !bVar8))
                          {
                            bVar8 = comparesEqual(&local_58,"-o");
                            iVar16 = 0;
                            bVar7 = true;
                            if ((!bVar8) && (bVar8 = comparesEqual(&local_58,"-output"), !bVar8)) {
                              if ((qmake_mode & ~QMAKE_GENERATE_PROJECT) == QMAKE_GENERATE_MAKEFILE)
                              {
                                bVar7 = comparesEqual(&local_58,"-nodepend");
                                if ((bVar7) ||
                                   (bVar7 = comparesEqual(&local_58,"-nodepends"), bVar7)) {
                                  mkfile::do_deps = false;
                                }
                                else {
                                  bVar7 = comparesEqual(&local_58,"-nomoc");
                                  if (bVar7) {
                                    mkfile::do_mocs = false;
                                  }
                                  else {
                                    bVar7 = comparesEqual(&local_58,"-nodependheuristics");
                                    if (bVar7) {
                                      mkfile::do_dep_heuristics = false;
                                    }
                                    else {
                                      bVar7 = comparesEqual(&local_58,"-E");
                                      if (!bVar7) {
                                        parseCommandLine();
                                        goto LAB_0029c638;
                                      }
                                      mkfile::do_preprocess = true;
                                    }
                                  }
                                }
                              }
                              else {
                                bVar7 = false;
                                if (qmake_mode == QMAKE_GENERATE_PROJECT) {
                                  bVar8 = comparesEqual(&local_58,"-nopwd");
                                  if (!bVar8) {
                                    parseCommandLine();
                                    iVar16 = 1;
                                    local_10c = 5;
                                    goto LAB_0029c5cb;
                                  }
                                  projfile::do_pwd = false;
                                }
                              }
                              goto LAB_0029c26e;
                            }
                            goto LAB_0029c5cb;
                          }
                          recursive = false;
                        }
                        QList<QString>::removeAt(args,(long)local_3c);
                        iVar16 = 2;
                        goto LAB_0029c5cb;
                      }
                      warn_level = 0;
                    }
                  }
                }
              }
LAB_0029c26e:
              iVar16 = 0;
              bVar7 = false;
            }
LAB_0029c5cb:
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
              }
            }
            if (iVar16 == 0) goto LAB_0029c60c;
            iVar10 = local_10c;
            if (iVar16 != 2) break;
          }
          if ((long)local_3c < (args->d).size) goto LAB_0029c10f;
          if (!bVar7) goto LAB_0029ca0f;
          parseCommandLine();
        }
        iVar10 = 5;
        break;
      }
      local_3c = local_3c + -1;
      QFile::setFileName((QString *)output);
      iVar11 = QList<QString>::begin(args);
      lVar13 = (long)local_3c;
      iVar12 = QList<QString>::begin(args);
      QList<QString>::erase(args,iVar11.i + lVar13,iVar12.i + (long)local_3c + 2);
      bVar7 = false;
      iVar10 = 0;
    } while ((long)local_3c < (args->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar10;
}

Assistant:

int
Option::parseCommandLine(QStringList &args, QMakeCmdLineParserState &state)
{
    enum { ArgNone, ArgOutput } argState = ArgNone;
    int x = 0;
    while (x < args.size()) {
        switch (argState) {
        case ArgOutput:
            Option::output.setFileName(args.at(x--));
            args.erase(args.begin() + x, args.begin() + x + 2);
            argState = ArgNone;
            continue;
        default:
            QMakeGlobals::ArgumentReturn cmdRet = globals->addCommandLineArguments(state, args, &x);
            if (cmdRet == QMakeGlobals::ArgumentMalformed) {
                fprintf(stderr, "***Option %s requires a parameter\n", qPrintable(args.at(x - 1)));
                return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
            }
            if (!globals->qtconf.isEmpty())
                QLibraryInfoPrivate::setQtconfManualPath(&globals->qtconf);
            if (cmdRet == QMakeGlobals::ArgumentsOk)
                break;
            Q_ASSERT(cmdRet == QMakeGlobals::ArgumentUnknown);
            QString arg = args.at(x);
            if (arg.startsWith(QLatin1Char('-'))) {
                if (arg == "-d") {
                    Option::debug_level++;
                } else if (arg == "-v" || arg == "-version" || arg == "--version") {
                    fprintf(stdout,
                            "QMake version %s\n"
                            "Using Qt version %s in %s\n",
                            QMAKE_VERSION_STR, QT_VERSION_STR,
                            QMakeLibraryInfo::path(QLibraryInfo::LibrariesPath)
                                    .toLatin1()
                                    .constData());
#ifdef QMAKE_OPENSOURCE_VERSION
                    fprintf(stdout, "QMake is Open Source software from The Qt Company Ltd and/or its subsidiary(-ies).\n");
#endif
                    return Option::QMAKE_CMDLINE_BAIL;
                } else if (arg == "-h" || arg == "-help" || arg == "--help") {
                    return Option::QMAKE_CMDLINE_SHOW_USAGE;
                } else if (arg == "-Wall") {
                    Option::warn_level |= WarnAll;
                } else if (arg == "-Wparser") {
                    Option::warn_level |= WarnParser;
                } else if (arg == "-Wlogic") {
                    Option::warn_level |= WarnLogic;
                } else if (arg == "-Wdeprecated") {
                    Option::warn_level |= WarnDeprecated;
                } else if (arg == "-Wnone") {
                    Option::warn_level = WarnNone;
                } else if (arg == "-r" || arg == "-recursive") {
                    Option::recursive = true;
                    args.removeAt(x);
                    continue;
                } else if (arg == "-nr" || arg == "-norecursive") {
                    Option::recursive = false;
                    args.removeAt(x);
                    continue;
                } else if (arg == "-o" || arg == "-output") {
                    argState = ArgOutput;
                } else {
                    if (Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                        Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                        if (arg == "-nodepend" || arg == "-nodepends") {
                            Option::mkfile::do_deps = false;
                        } else if (arg == "-nomoc") {
                            Option::mkfile::do_mocs = false;
                        } else if (arg == "-nodependheuristics") {
                            Option::mkfile::do_dep_heuristics = false;
                        } else if (arg == "-E") {
                            Option::mkfile::do_preprocess = true;
                        } else {
                            fprintf(stderr, "***Unknown option %s\n", arg.toLatin1().constData());
                            return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                        }
                    } else if (Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT) {
                        if (arg == "-nopwd") {
                            Option::projfile::do_pwd = false;
                        } else {
                            fprintf(stderr, "***Unknown option %s\n", arg.toLatin1().constData());
                            return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                        }
                    }
                }
            } else {
                bool handled = true;
                if(Option::qmake_mode == Option::QMAKE_QUERY_PROPERTY ||
                    Option::qmake_mode == Option::QMAKE_SET_PROPERTY ||
                    Option::qmake_mode == Option::QMAKE_UNSET_PROPERTY) {
                    Option::prop::properties.append(arg);
                } else {
                    QFileInfo fi(arg);
                    if(!fi.makeAbsolute()) //strange
                        arg = fi.filePath();
                    if(Option::qmake_mode == Option::QMAKE_GENERATE_MAKEFILE ||
                       Option::qmake_mode == Option::QMAKE_GENERATE_PRL) {
                        if(fi.isDir()) {
                            QString singleProFileCandidate;
                            QString proj = detectProjectFile(arg, &singleProFileCandidate);
                            if (proj.isNull()) {
                                fprintf(stderr, "***Cannot detect .pro file in directory '%s'.\n\n"
                                        "QMake expects the file '%s' "
                                        "or exactly one .pro file in the given directory.\n",
                                        qUtf8Printable(arg),
                                        qUtf8Printable(singleProFileCandidate));
                                return Option::QMAKE_CMDLINE_ERROR;
                            }
                            Option::mkfile::project_files.append(proj);
                        } else {
                            Option::mkfile::project_files.append(arg);
                        }
                    } else if(Option::qmake_mode == Option::QMAKE_GENERATE_PROJECT) {
                        Option::projfile::project_dirs.append(arg);
                    } else {
                        handled = false;
                    }
                }
                if(!handled) {
                    return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
                }
                args.removeAt(x);
                continue;
            }
        }
        x++;
    }
    if (argState != ArgNone) {
        fprintf(stderr, "***Option %s requires a parameter\n", qPrintable(args.at(x - 1)));
        return Option::QMAKE_CMDLINE_SHOW_USAGE | Option::QMAKE_CMDLINE_ERROR;
    }
    return Option::QMAKE_CMDLINE_SUCCESS;
}